

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O1

_Bool Curl_check_noproxy(char *name,char *no_proxy,_Bool *spacesep)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  size_t __n;
  ulong max;
  byte *pbVar8;
  byte *pbVar9;
  _Bool _Var10;
  size_t unaff_R13;
  char *__src;
  uint uVar11;
  size_t sVar12;
  bool bVar13;
  uchar check [16];
  uchar address_1 [16];
  char checkip [128];
  char hostip [128];
  int local_17c;
  uint local_178 [4];
  uint local_168 [6];
  char *local_150;
  ulong local_148;
  _Bool *local_140;
  char local_138 [128];
  char local_b8 [136];
  
  *spacesep = false;
  if (name == (char *)0x0) {
    return false;
  }
  cVar1 = *name;
  if (cVar1 == '\0') {
    return false;
  }
  if (no_proxy == (char *)0x0) {
    return false;
  }
  if (*no_proxy == '\0') {
    return false;
  }
  iVar3 = strcmp("*",no_proxy);
  if (iVar3 == 0) {
    _Var10 = true;
    bVar13 = false;
    goto LAB_006b64cf;
  }
  if (cVar1 == '[') {
    pcVar5 = strchr(name,0x5d);
    if (pcVar5 == (char *)0x0) {
LAB_006b61ec:
      bVar13 = false;
      local_17c = 0;
    }
    else {
      __src = name + 1;
      unaff_R13 = (long)pcVar5 - (long)__src;
      name = __src;
      if (0x7f < unaff_R13) goto LAB_006b61ec;
      name = local_b8;
      memcpy(name,__src,unaff_R13);
      local_b8[unaff_R13] = '\0';
      local_17c = 2;
      bVar13 = true;
    }
    if (bVar13) goto LAB_006b61fc;
    bVar13 = false;
  }
  else {
    unaff_R13 = strlen(name);
    iVar3 = inet_pton(2,name,local_b8);
    local_17c = 1;
    if (iVar3 != 1) {
      unaff_R13 = unaff_R13 - (name[unaff_R13 - 1] == '.');
      local_17c = 0;
    }
LAB_006b61fc:
    if (*no_proxy != '\0') {
      _Var10 = false;
      local_150 = name;
      local_148 = unaff_R13;
      local_140 = spacesep;
LAB_006b6221:
      pbVar9 = (byte *)no_proxy + -1;
      for (pbVar8 = (byte *)no_proxy; (bVar2 = *pbVar8, bVar2 == 9 || (bVar2 == 0x20));
          pbVar8 = pbVar8 + 1) {
        pbVar9 = pbVar9 + 1;
      }
      sVar12 = 0xffffffffffffffff;
      lVar7 = 0;
      while ((0x2c < (ulong)pbVar8[sVar12 + 1] ||
             ((0x100100000201U >> ((ulong)pbVar8[sVar12 + 1] & 0x3f) & 1) == 0))) {
        lVar7 = lVar7 + -1;
        sVar12 = sVar12 + 1;
        pbVar9 = pbVar9 + 1;
      }
      no_proxy = (char *)(pbVar8 + -lVar7);
      if (lVar7 == 0) goto LAB_006b6465;
      __n = -lVar7;
      if (local_17c == 0) {
        if (pbVar8[sVar12] == 0x2e) {
          __n = sVar12;
        }
        if (__n == 0) {
          __n = 0;
        }
        else if (bVar2 == 0x2e) {
          pbVar8 = pbVar8 + 1;
          __n = __n - 1;
        }
        lVar7 = local_148 - __n;
        max = local_148;
        pcVar5 = name;
        if (lVar7 != 0) {
          if ((local_148 < __n || lVar7 == 0) || (name[lVar7 + -1] != '.')) goto LAB_006b6465;
          max = __n;
          pcVar5 = name + lVar7;
        }
        iVar3 = curl_strnequal((char *)pbVar8,pcVar5,max);
        bVar13 = iVar3 != 0;
      }
      else {
        uVar4 = 0;
        bVar13 = false;
        if (__n < 0x7f || lVar7 == -0x7f) {
          memcpy(local_138,pbVar8,__n);
          local_138[sVar12 + 1] = '\0';
          pcVar5 = strchr(local_138,0x2f);
          if (pcVar5 != (char *)0x0) {
            uVar4 = atoi(pcVar5 + 1);
            *pcVar5 = '\0';
          }
          name = local_150;
          if (local_17c == 2) {
            if (uVar4 == 0) {
              uVar4 = 0x80;
            }
            iVar3 = inet_pton(10,local_150,local_168);
            if (iVar3 == 1) {
              iVar3 = inet_pton(10,local_138,local_178);
              bVar13 = false;
              if ((uVar4 < 0x88) && (iVar3 == 1)) {
                uVar11 = uVar4 >> 3;
                uVar6 = uVar4 & 7;
                if (((uVar11 == 0x10 && uVar6 != 0) ||
                    ((7 < uVar4 && (iVar3 = bcmp(local_168,local_178,(ulong)uVar11), iVar3 != 0))))
                   || ((uVar6 != 0 &&
                       ((byte)((*(byte *)((long)local_178 + (ulong)uVar11) ^
                               *(byte *)((long)local_168 + (ulong)uVar11)) >>
                              (8U - (char)uVar6 & 0x1f)) == 0)))) goto LAB_006b6407;
                bVar13 = true;
              }
            }
            else {
LAB_006b6407:
              bVar13 = false;
            }
          }
          else {
            bVar13 = false;
            local_168[0] = 0;
            local_178[0] = 0;
            if (uVar4 < 0x21) {
              iVar3 = inet_pton(2,local_150,local_168);
              if ((iVar3 != 1) || (iVar3 = inet_pton(2,local_138,local_178), iVar3 != 1))
              goto LAB_006b6407;
              if ((uVar4 & 0x1f) == 0) {
                bVar13 = local_168[0] == local_178[0];
              }
              else {
                uVar6 = local_178[0] ^ local_168[0];
                bVar13 = (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                         uVar6 << 0x18) >> (-(char)uVar4 & 0x1fU) == 0;
              }
            }
          }
        }
      }
      if (!bVar13) {
LAB_006b6465:
        do {
          bVar2 = *no_proxy;
          if (bVar2 < 0x20) {
            if (bVar2 != 9) goto code_r0x006b6472;
          }
          else if (bVar2 != 0x20) {
            if (bVar2 != 0x2c) goto LAB_006b6491;
            goto LAB_006b647d;
          }
          no_proxy = (char *)((byte *)no_proxy + 1);
          pbVar9 = pbVar9 + 1;
        } while( true );
      }
      _Var10 = true;
      uVar4 = 1;
      goto LAB_006b649e;
    }
    bVar13 = true;
  }
  _Var10 = false;
LAB_006b64cf:
  if (bVar13) {
    return false;
  }
  return _Var10;
code_r0x006b6472:
  if (bVar2 == 0) {
LAB_006b647d:
    do {
      pbVar8 = pbVar9 + 1;
      no_proxy = (char *)(pbVar9 + 1);
      pbVar9 = (byte *)no_proxy;
    } while (*pbVar8 == 0x2c);
    uVar4 = 0;
  }
  else {
LAB_006b6491:
    *local_140 = true;
    uVar4 = 2;
  }
LAB_006b649e:
  if ((uVar4 & 1) != 0) goto LAB_006b64bf;
  if (*no_proxy == 0) goto LAB_006b64bd;
  goto LAB_006b6221;
LAB_006b64bd:
  uVar4 = 0;
LAB_006b64bf:
  bVar13 = uVar4 == 0;
  goto LAB_006b64cf;
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy,
                        bool *spacesep)
{
  char hostip[128];
  *spacesep = FALSE;
  /*
   * If we don't have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the host name */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            bits = atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma! */
      if(*p && (*p != ',')) {
        *spacesep = TRUE;
        continue;
      }
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}